

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

ssize_t mqtt_unpack_publish_response(mqtt_response *mqtt_response,uint8_t *buf)

{
  byte bVar1;
  uint uVar2;
  ushort uVar3;
  ssize_t sVar4;
  ushort *puVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  
  bVar1 = (mqtt_response->fixed_header).field_0x4;
  (mqtt_response->decoded).connack.session_present_flag = bVar1 >> 3 & 1;
  bVar7 = bVar1 >> 1 & 3;
  (mqtt_response->decoded).publish.qos_level = bVar7;
  (mqtt_response->decoded).publish.retain_flag = bVar1 & 1;
  uVar2 = (mqtt_response->fixed_header).remaining_length;
  sVar4 = -0x7ffffff4;
  if (3 < uVar2) {
    uVar3 = *(ushort *)buf << 8 | *(ushort *)buf >> 8;
    (mqtt_response->decoded).publish.topic_name_size = uVar3;
    (mqtt_response->decoded).suback.return_codes = buf + 2;
    puVar5 = (ushort *)(buf + (ulong)uVar3 + 2);
    if (bVar7 == 0) {
      iVar8 = -2;
    }
    else {
      (mqtt_response->decoded).publish.packet_id = *puVar5 << 8 | *puVar5 >> 8;
      puVar5 = (ushort *)(buf + (ulong)uVar3 + 4);
      iVar8 = -4;
    }
    uVar6 = (ulong)((uVar2 + iVar8) - (uint)uVar3);
    (mqtt_response->decoded).publish.application_message = puVar5;
    (mqtt_response->decoded).publish.application_message_size = uVar6;
    sVar4 = (long)puVar5 + (uVar6 - (long)buf);
  }
  return sVar4;
}

Assistant:

ssize_t mqtt_unpack_publish_response(struct mqtt_response *mqtt_response, const uint8_t *buf)
{    
    const uint8_t *const start = buf;
    struct mqtt_fixed_header *fixed_header;
    struct mqtt_response_publish *response;
    
    fixed_header = &(mqtt_response->fixed_header);
    response = &(mqtt_response->decoded.publish);

    /* get flags */
    response->dup_flag = (fixed_header->control_flags & MQTT_PUBLISH_DUP) >> 3;
    response->qos_level = (fixed_header->control_flags & MQTT_PUBLISH_QOS_MASK) >> 1;
    response->retain_flag = fixed_header->control_flags & MQTT_PUBLISH_RETAIN;

    /* make sure that remaining length is valid */
    if (mqtt_response->fixed_header.remaining_length < 4) {
        return MQTT_ERROR_MALFORMED_RESPONSE;
    }

    /* parse variable header */
    response->topic_name_size = __mqtt_unpack_uint16(buf);
    buf += 2;
    response->topic_name = buf;
    buf += response->topic_name_size;

    if (response->qos_level > 0) {
        response->packet_id = __mqtt_unpack_uint16(buf);
        buf += 2;
    }

    /* get payload */
    response->application_message = buf;
    if (response->qos_level == 0) {
        response->application_message_size = fixed_header->remaining_length - response->topic_name_size - 2;
    } else {
        response->application_message_size = fixed_header->remaining_length - response->topic_name_size - 4;
    }
    buf += response->application_message_size;
    
    /* return number of bytes consumed */
    return buf - start;
}